

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O2

void sysbvm_analysisAndEvaluationEnvironment_clearUnwindingRecords
               (sysbvm_context_t *context,sysbvm_tuple_t environment)

{
  _Bool _Var1;
  
  _Var1 = sysbvm_environment_isAnalysisAndEvaluationEnvironment(context,environment);
  if (_Var1) {
    *(undefined8 *)(environment + 0x60) = 0;
    *(undefined8 *)(environment + 0x68) = 0;
    *(undefined8 *)(environment + 0x70) = 0;
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_analysisAndEvaluationEnvironment_clearUnwindingRecords(sysbvm_context_t *context, sysbvm_tuple_t environment)
{
    if(!sysbvm_environment_isAnalysisAndEvaluationEnvironment(context, environment))
        return;

    sysbvm_analysisAndEvaluationEnvironment_t *environmentObject = (sysbvm_analysisAndEvaluationEnvironment_t*)environment;
    environmentObject->breakTarget = SYSBVM_NULL_TUPLE;
    environmentObject->continueTarget = SYSBVM_NULL_TUPLE;
    environmentObject->returnTarget = SYSBVM_NULL_TUPLE;
}